

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.h
# Opt level: O1

void __thiscall mkvparser::MasteringMetadata::~MasteringMetadata(MasteringMetadata *this)

{
  if (this->r != (PrimaryChromaticity *)0x0) {
    operator_delete(this->r);
  }
  if (this->g != (PrimaryChromaticity *)0x0) {
    operator_delete(this->g);
  }
  if (this->b != (PrimaryChromaticity *)0x0) {
    operator_delete(this->b);
  }
  if (this->white_point != (PrimaryChromaticity *)0x0) {
    operator_delete(this->white_point);
    return;
  }
  return;
}

Assistant:

~MasteringMetadata() {
    delete r;
    delete g;
    delete b;
    delete white_point;
  }